

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

bool __thiscall
CommandLineArguments::setOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  bool bVar1;
  bool bVar2;
  OutputType OVar3;
  size_t sVar4;
  int ac_00;
  SimpleString outputType;
  SimpleString SStack_58;
  undefined1 local_48 [32];
  
  ac_00 = 0x14c8d7;
  SimpleString::SimpleString(&SStack_58,"-o");
  getParameterField((CommandLineArguments *)local_48,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&SStack_58);
  sVar4 = SimpleString::size((SimpleString *)local_48);
  if (sVar4 == 0) {
LAB_001457a2:
    bVar2 = false;
  }
  else {
    SimpleString::SimpleString(&SStack_58,"normal");
    bVar1 = operator==((SimpleString *)local_48,&SStack_58);
    bVar2 = true;
    if (!bVar1) {
      SimpleString::SimpleString((SimpleString *)(local_48 + 0x10),"eclipse");
      bVar2 = operator==((SimpleString *)local_48,(SimpleString *)(local_48 + 0x10));
      SimpleString::~SimpleString((SimpleString *)(local_48 + 0x10));
    }
    SimpleString::~SimpleString(&SStack_58);
    OVar3 = OUTPUT_ECLIPSE;
    if (bVar2 == false) {
      SimpleString::SimpleString(&SStack_58,"junit");
      bVar2 = operator==((SimpleString *)local_48,&SStack_58);
      SimpleString::~SimpleString(&SStack_58);
      OVar3 = OUTPUT_JUNIT;
      if (!bVar2) {
        SimpleString::SimpleString(&SStack_58,"teamcity");
        bVar2 = operator==((SimpleString *)local_48,&SStack_58);
        SimpleString::~SimpleString(&SStack_58);
        OVar3 = OUTPUT_TEAMCITY;
        if (!bVar2) goto LAB_001457a2;
      }
    }
    this->outputType_ = OVar3;
    bVar2 = true;
  }
  SimpleString::~SimpleString((SimpleString *)local_48);
  return bVar2;
}

Assistant:

bool CommandLineArguments::setOutputType(int ac, const char *const *av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}